

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.cpp
# Opt level: O2

HLOCAL LocalAlloc(UINT uFlags,SIZE_T uBytes)

{
  HANDLE hHeap;
  LPVOID pvVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if ((uFlags & 0xffffffbf) == 0) {
      hHeap = GetProcessHeap();
      pvVar1 = HeapAlloc(hHeap,uFlags >> 3,uBytes);
    }
    else {
      pvVar1 = (LPVOID)0x0;
      fprintf(_stderr,"] %s %s:%d","AllocFlagsToHeapAllocFlags",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/local.cpp"
              ,0x2a);
      fprintf(_stderr,"Invalid parameter AllocFlags=0x%x\n",uFlags);
      SetLastError(0x57);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return pvVar1;
    }
  }
  abort();
}

Assistant:

HLOCAL
PALAPI
LocalAlloc(
	   IN UINT uFlags,
	   IN SIZE_T uBytes)
{
    LPVOID lpRetVal = NULL;
    PERF_ENTRY(LocalAlloc);
    ENTRY("LocalAlloc (uFlags=%#x, uBytes=%u)\n", uFlags, uBytes);

    if (!AllocFlagsToHeapAllocFlags (uFlags, &uFlags)) {
        goto done;
    }

    lpRetVal = HeapAlloc( GetProcessHeap(), uFlags, uBytes );

done:
    LOGEXIT( "LocalAlloc returning %p.\n", lpRetVal );
    PERF_EXIT(LocalAlloc);
    return (HLOCAL) lpRetVal;
}